

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

Expr * __thiscall SQCompilation::SQParser::LogicalOrExp(SQParser *this)

{
  uint32_t uVar1;
  BinExpr *args_1;
  Expr *args_2;
  int iVar2;
  
  if (500 < this->_depth) {
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  args_1 = (BinExpr *)LogicalAndExp(this);
  iVar2 = 1;
  while( true ) {
    if (500 < this->_depth) {
      reportDiagnostic(this,0x1d);
    }
    uVar1 = this->_depth;
    this->_depth = uVar1 + 1;
    if (this->_token != 0x10f) break;
    Lex(this);
    args_2 = LogicalOrExp(this);
    iVar2 = iVar2 + 1;
    args_1 = newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                       (this,TO_OROR,&args_1->super_Expr,args_2);
  }
  this->_depth = uVar1 - iVar2;
  return &args_1->super_Expr;
}

Assistant:

Expr* SQParser::LogicalOrExp()
{
    NestingChecker nc(this);
    Expr *lhs = LogicalAndExp();
    for (;;) {
        nc.inc();
        if (_token == TK_OR) {
            Lex();

            Expr *rhs = LogicalOrExp();
            lhs = newNode<BinExpr>(TO_OROR, lhs, rhs);
        }
        else return lhs;
    }
}